

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask18_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar1 = in[1];
  uVar2 = in[3];
  uVar3 = in[4];
  *out = uVar1 << 0x12 | *in;
  uVar4 = in[5];
  out[1] = uVar2 << 0x16 | in[2] << 4 | uVar1 >> 0xe;
  uVar5 = in[6];
  uVar1 = in[8];
  out[2] = uVar4 << 0x1a | uVar3 << 8 | uVar2 >> 10;
  uVar2 = in[7];
  out[3] = uVar2 << 0x1e | uVar5 << 0xc | uVar4 >> 6;
  uVar4 = in[10];
  out[4] = uVar1 << 0x10 | uVar2 >> 2;
  uVar3 = in[0xb];
  uVar2 = in[0xc];
  out[5] = uVar4 << 0x14 | in[9] << 2 | uVar1 >> 0x10;
  out[6] = uVar2 << 0x18 | uVar3 << 6 | uVar4 >> 0xc;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(in + 0xe);
  auVar6 = vpsllvd_avx2(auVar7,_DAT_0019cd00);
  auVar7 = vpinsrd_avx(ZEXT416(in[0xd] << 10 | uVar2 >> 8),
                       (uint)(*(ulong *)(in + 0xe) >> 4) & 0xfffffff,1);
  auVar7 = vpor_avx(auVar6,auVar7);
  *(long *)(out + 7) = auVar7._0_8_;
  return out + 9;
}

Assistant:

uint32_t *__fastpackwithoutmask18_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (18 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (18 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (18 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (18 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (18 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (18 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (18 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (18 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  ++in;

  return out;
}